

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

int NULLC::TypeSize(int *a)

{
  ExternTypeInfo *pEVar1;
  int *a_local;
  
  if (a == (int *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    a_local._4_4_ = 0;
  }
  else {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*a);
    a_local._4_4_ = pEVar1->size;
  }
  return a_local._4_4_;
}

Assistant:

int NULLC::TypeSize(int* a)
{
	if(!a)
	{
		nullcThrowError("ERROR: null pointer access");
		return 0;
	}

	return linker->exTypes[*a].size;
}